

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_sub_32_er_pi(void)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  uVar2 = OPER_AY_PI_32();
  uVar1 = *(uint *)((long)m68ki_cpu.dar + uVar3);
  m68ki_cpu.not_z_flag = uVar1 - uVar2;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.x_flag =
       ((m68ki_cpu.not_z_flag | uVar2) & ~uVar1 | m68ki_cpu.not_z_flag & uVar2) >> 0x17;
  m68ki_cpu.v_flag = ((uVar1 ^ m68ki_cpu.not_z_flag) & (uVar2 ^ uVar1)) >> 0x18;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *(uint *)((long)m68ki_cpu.dar + uVar3) = m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_sub_32_er_pi(void)
{
	uint* r_dst = &DX;
	uint src = OPER_AY_PI_32();
	uint dst = *r_dst;
	uint res = dst - src;

	FLAG_N = NFLAG_32(res);
	FLAG_X = FLAG_C = CFLAG_SUB_32(src, dst, res);
	FLAG_V = VFLAG_SUB_32(src, dst, res);
	FLAG_Z = MASK_OUT_ABOVE_32(res);

	*r_dst = FLAG_Z;
}